

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall cmSourceFileLocation::cmSourceFileLocation(cmSourceFileLocation *this)

{
  cmSourceFileLocation *this_local;
  
  this->Makefile = (cmMakefile *)0x0;
  this->AmbiguousDirectory = true;
  this->AmbiguousExtension = true;
  std::__cxx11::string::string((string *)&this->Directory);
  std::__cxx11::string::string((string *)&this->Name);
  return;
}

Assistant:

cmSourceFileLocation::cmSourceFileLocation()
  : Makefile(0), AmbiguousDirectory(true), AmbiguousExtension(true)
{

}